

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

Node * __thiscall
llvm::FoldingSetBase::FindNodeOrInsertPos
          (FoldingSetBase *this,FoldingSetNodeID *ID,void **InsertPos)

{
  uint Hash;
  uint uVar1;
  void **ppvVar2;
  Node *NodeInBucket;
  FoldingSetNodeID TempID;
  void *Probe;
  void **Bucket;
  uint IDHash;
  void **InsertPos_local;
  FoldingSetNodeID *ID_local;
  FoldingSetBase *this_local;
  
  Hash = FoldingSetNodeID::ComputeHash(ID);
  ppvVar2 = GetBucketFor(Hash,this->Buckets,this->NumBuckets);
  TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ = *ppvVar2;
  *InsertPos = (void *)0x0;
  FoldingSetNodeID::FoldingSetNodeID((FoldingSetNodeID *)&NodeInBucket);
  while (this_local = (FoldingSetBase *)
                      GetNextPtr((void *)TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.
                                         InlineElts._120_8_), this_local != (FoldingSetBase *)0x0) {
    uVar1 = (*this->_vptr_FoldingSetBase[2])(this,this_local,ID,(ulong)Hash,&NodeInBucket);
    if ((uVar1 & 1) != 0) goto LAB_0022a6c0;
    FoldingSetNodeID::clear((FoldingSetNodeID *)&NodeInBucket);
    TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ =
         Node::getNextInBucket((Node *)this_local);
  }
  *InsertPos = ppvVar2;
  this_local = (FoldingSetBase *)0x0;
LAB_0022a6c0:
  FoldingSetNodeID::~FoldingSetNodeID((FoldingSetNodeID *)&NodeInBucket);
  return (Node *)this_local;
}

Assistant:

FoldingSetBase::Node *
FoldingSetBase::FindNodeOrInsertPos(const FoldingSetNodeID &ID,
                                    void *&InsertPos) {
  unsigned IDHash = ID.ComputeHash();
  void **Bucket = GetBucketFor(IDHash, Buckets, NumBuckets);
  void *Probe = *Bucket;

  InsertPos = nullptr;

  FoldingSetNodeID TempID;
  while (Node *NodeInBucket = GetNextPtr(Probe)) {
    if (NodeEquals(NodeInBucket, ID, IDHash, TempID))
      return NodeInBucket;
    TempID.clear();

    Probe = NodeInBucket->getNextInBucket();
  }

  // Didn't find the node, return null with the bucket as the InsertPos.
  InsertPos = Bucket;
  return nullptr;
}